

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::Generate
          (ImmutableServiceGenerator *this,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  ServiceDescriptor *pSVar3;
  Context *context;
  int i;
  char *pcVar4;
  char *pcVar5;
  string local_70;
  string local_50;
  
  pSVar3 = (this->super_ServiceGenerator).descriptor_;
  cVar2 = *(char *)(*(long *)(*(long *)(pSVar3 + 0x10) + 0xa0) + 0xa0);
  WriteServiceDocComment(printer,pSVar3);
  pSVar3 = (this->super_ServiceGenerator).descriptor_;
  context = this->context_;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"","");
  MaybePrintGeneratedAnnotation<google::protobuf::ServiceDescriptor_const>
            (context,printer,pSVar3,true,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = "static";
  if (cVar2 != '\0') {
    pcVar5 = "";
  }
  paVar1 = &local_70.field_2;
  pcVar4 = pcVar5 + 6;
  if (cVar2 != '\0') {
    pcVar4 = pcVar5;
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar5,pcVar4);
  io::Printer::Print(printer,
                     "public $static$ abstract class $classname$\n    implements com.google.protobuf.Service {\n"
                     ,"static",&local_70,"classname",
                     *(string **)(this->super_ServiceGenerator).descriptor_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"protected $classname$() {}\n\n","classname",
                     *(string **)(this->super_ServiceGenerator).descriptor_);
  GenerateInterface(this,printer);
  GenerateNewReflectiveServiceMethod(this,printer);
  GenerateNewReflectiveBlockingServiceMethod(this,printer);
  GenerateAbstractMethods(this,printer);
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_70,this->name_resolver_,
             *(FileDescriptor **)((this->super_ServiceGenerator).descriptor_ + 0x10),true);
  pSVar3 = (this->super_ServiceGenerator).descriptor_;
  SimpleItoa_abi_cxx11_
            (&local_50,
             (protobuf *)
             (ulong)(uint)((int)((ulong)((long)pSVar3 - *(long *)(*(long *)(pSVar3 + 0x10) + 0x80))
                                >> 4) * -0x55555555),i);
  io::Printer::Print(printer,
                     "public static final\n    com.google.protobuf.Descriptors.ServiceDescriptor\n    getDescriptor() {\n  return $file$.getDescriptor().getServices().get($index$);\n}\n"
                     ,"file",&local_70,"index",&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Print(printer,
                     "public final com.google.protobuf.Descriptors.ServiceDescriptor\n    getDescriptorForType() {\n  return getDescriptor();\n}\n"
                    );
  GenerateCallMethod(this,printer);
  GenerateGetPrototype(this,REQUEST,printer);
  GenerateGetPrototype(this,RESPONSE,printer);
  GenerateStub(this,printer);
  GenerateBlockingStub(this,printer);
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(class_scope:$full_name$)\n","full_name",
                     *(string **)((this->super_ServiceGenerator).descriptor_ + 8));
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  return;
}

Assistant:

void ImmutableServiceGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);
  WriteServiceDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);
  printer->Print(
    "public $static$ abstract class $classname$\n"
    "    implements com.google.protobuf.Service {\n",
    "static", is_own_file ? "" : "static",
    "classname", descriptor_->name());
  printer->Indent();

  printer->Print(
    "protected $classname$() {}\n\n",
    "classname", descriptor_->name());

  GenerateInterface(printer);

  GenerateNewReflectiveServiceMethod(printer);
  GenerateNewReflectiveBlockingServiceMethod(printer);

  GenerateAbstractMethods(printer);

  // Generate getDescriptor() and getDescriptorForType().
  printer->Print(
    "public static final\n"
    "    com.google.protobuf.Descriptors.ServiceDescriptor\n"
    "    getDescriptor() {\n"
    "  return $file$.getDescriptor().getServices().get($index$);\n"
    "}\n",
    "file", name_resolver_->GetImmutableClassName(descriptor_->file()),
    "index", SimpleItoa(descriptor_->index()));
  GenerateGetDescriptorForType(printer);

  // Generate more stuff.
  GenerateCallMethod(printer);
  GenerateGetPrototype(REQUEST, printer);
  GenerateGetPrototype(RESPONSE, printer);
  GenerateStub(printer);
  GenerateBlockingStub(printer);

  // Add an insertion point.
  printer->Print(
    "\n"
    "// @@protoc_insertion_point(class_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n\n");
}